

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::usage(StdOutput *this,CmdLineInterface *_cmd)

{
  ostream *poVar1;
  void *pvVar2;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"USAGE: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  _shortUsage(this,_cmd,(ostream *)&std::cout);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Where: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  _longUsage(this,_cmd,(ostream *)&std::cout);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void StdOutput::usage(CmdLineInterface& _cmd ) 
{
	std::cout << std::endl << "USAGE: " << std::endl << std::endl; 

	_shortUsage( _cmd, std::cout );

	std::cout << std::endl << std::endl << "Where: " << std::endl << std::endl;

	_longUsage( _cmd, std::cout );

	std::cout << std::endl; 

}